

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O1

void Imf_2_5::anon_unknown_15::calculateNumTiles
               (int *numTiles,int numLevels,int min,int max,int size,LevelRoundingMode rmode)

{
  int iVar1;
  ArgExc *this;
  ulong uVar2;
  
  if (0 < numLevels) {
    uVar2 = 0;
    do {
      iVar1 = levelSize(min,max,(int)uVar2,rmode);
      if (-0x80000000 - size < iVar1) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this,"Invalid size.");
        __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      numTiles[uVar2] = (iVar1 + size + -1) / size;
      uVar2 = uVar2 + 1;
    } while ((uint)numLevels != uVar2);
  }
  return;
}

Assistant:

void
calculateNumTiles (int *numTiles,
		   int numLevels,
		   int min, int max,
		   int size,
		   LevelRoundingMode rmode)
{
    for (int i = 0; i < numLevels; i++)
    {
        int l = levelSize (min, max, i, rmode);
        if (l > std::numeric_limits<int>::max() - size + 1)
            throw IEX_NAMESPACE::ArgExc ("Invalid size.");

        numTiles[i] = (l + size - 1) / size;
    }
}